

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O2

void __thiscall wasm::OptimizationOptions::addDefaultOptPasses(OptimizationOptions *this)

{
  PassInfo local_70;
  string local_40;
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"O",&local_19);
  PassInfo::PassInfo(&local_70,&local_40,(this->super_ToolOptions).passOptions.optimizeLevel,
                     (this->super_ToolOptions).passOptions.shrinkLevel);
  std::
  vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ::emplace_back<wasm::OptimizationOptions::PassInfo>(&this->passes,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void addDefaultOptPasses() {
    passes.push_back(PassInfo{
      DEFAULT_OPT_PASSES, passOptions.optimizeLevel, passOptions.shrinkLevel});
  }